

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O2

void unpackforblock26(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t *puVar15;
  uint uVar16;
  
  puVar1 = (ulong *)*pw;
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  uVar6 = puVar1[4];
  uVar7 = puVar1[5];
  uVar8 = puVar1[6];
  uVar9 = puVar1[7];
  uVar10 = puVar1[8];
  uVar11 = puVar1[9];
  uVar12 = puVar1[10];
  uVar13 = puVar1[0xb];
  uVar14 = puVar1[0xc];
  puVar15 = *pout;
  *pw = (uint8_t *)(puVar1 + 0xd);
  puVar15[4] = ((uint)(uVar4 << 0x18) & 0x3ffffff | (uint)(uVar3 >> 0x28)) + base;
  puVar15[5] = ((uint)(uVar4 >> 2) & 0x3ffffff) + base;
  puVar15[6] = ((uint)(uVar4 >> 0x1c) & 0x3ffffff) + base;
  puVar15[7] = ((uint)(uVar5 << 10) & 0x3ffffff | (uint)(uVar4 >> 0x36)) + base;
  *puVar15 = ((uint)uVar2 & 0x3ffffff) + base;
  puVar15[1] = ((uint)(uVar2 >> 0x1a) & 0x3ffffff) + base;
  puVar15[2] = ((uint)(uVar3 << 0xc) & 0x3ffffff | (uint)(uVar2 >> 0x34)) + base;
  puVar15[3] = ((uint)(uVar3 >> 0xe) & 0x3ffffff) + base;
  puVar15[8] = ((uint)(uVar5 >> 0x10) & 0x3ffffff) + base;
  puVar15[9] = ((uint)(uVar6 << 0x16) & 0x3ffffff | (uint)(uVar5 >> 0x2a)) + base;
  puVar15[10] = ((uint)(uVar6 >> 4) & 0x3ffffff) + base;
  puVar15[0xb] = ((uint)(uVar6 >> 0x1e) & 0x3ffffff) + base;
  puVar15[0xc] = ((uint)(uVar7 << 8) & 0x3ffffff | (uint)(byte)(uVar6 >> 0x38)) + base;
  puVar15[0xd] = ((uint)(uVar7 >> 0x12) & 0x3ffffff) + base;
  puVar15[0xe] = ((uint)(uVar8 << 0x14) & 0x3ffffff | (uint)(uVar7 >> 0x2c)) + base;
  puVar15[0xf] = ((uint)(uVar8 >> 6) & 0x3ffffff) + base;
  uVar16 = (uint)(uVar8 >> 0x20);
  puVar15[0x10] = (uVar16 & 0x3ffffff) + base;
  puVar15[0x11] = ((uint)(uVar9 << 6) & 0x3ffffff | uVar16 >> 0x1a) + base;
  puVar15[0x12] = ((uint)(uVar9 >> 0x14) & 0x3ffffff) + base;
  puVar15[0x13] = ((uint)(uVar10 << 0x12) & 0x3ffffff | (uint)(uVar9 >> 0x2e)) + base;
  puVar15[0x14] = ((uint)(uVar10 >> 8) & 0x3ffffff) + base;
  uVar16 = (uint)(uVar10 >> 0x20);
  puVar15[0x15] = (uVar16 >> 2 & 0x3ffffff) + base;
  puVar15[0x16] = ((uint)(uVar11 << 4) & 0x3ffffff | uVar16 >> 0x1c) + base;
  puVar15[0x17] = ((uint)(uVar11 >> 0x16) & 0x3ffffff) + base;
  puVar15[0x18] = ((uint)(uVar12 << 0x10) & 0x3ffffff | (uint)(ushort)(uVar11 >> 0x30)) + base;
  puVar15[0x19] = ((uint)(uVar12 >> 10) & 0x3ffffff) + base;
  uVar16 = (uint)(uVar12 >> 0x20);
  puVar15[0x1a] = (uVar16 >> 4 & 0x3ffffff) + base;
  puVar15[0x1b] = ((uint)(uVar13 << 2) & 0x3ffffff | uVar16 >> 0x1e) + base;
  puVar15[0x1c] = ((uint)(uVar13 >> 0x18) & 0x3ffffff) + base;
  puVar15[0x1d] = ((uint)(uVar14 << 0xe) & 0x3ffffff | (uint)(uVar13 >> 0x32)) + base;
  puVar15[0x1e] = ((uint)(uVar14 >> 0xc) & 0x3ffffff) + base;
  puVar15[0x1f] = (uint)(uVar14 >> 0x26) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock26(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(67108863);
  /* we are going to access  13 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  uint64_t w11 = pw64[11];
  uint64_t w12 = pw64[12];
  *pw += 104; /* we used up 104 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 26) & mask);
  out[2] = base + (uint32_t)(((w0 >> 52) | (w1 << 12)) & mask);
  out[3] = base + (uint32_t)((w1 >> 14) & mask);
  out[4] = base + (uint32_t)(((w1 >> 40) | (w2 << 24)) & mask);
  out[5] = base + (uint32_t)((w2 >> 2) & mask);
  out[6] = base + (uint32_t)((w2 >> 28) & mask);
  out[7] = base + (uint32_t)(((w2 >> 54) | (w3 << 10)) & mask);
  out[8] = base + (uint32_t)((w3 >> 16) & mask);
  out[9] = base + (uint32_t)(((w3 >> 42) | (w4 << 22)) & mask);
  out[10] = base + (uint32_t)((w4 >> 4) & mask);
  out[11] = base + (uint32_t)((w4 >> 30) & mask);
  out[12] = base + (uint32_t)(((w4 >> 56) | (w5 << 8)) & mask);
  out[13] = base + (uint32_t)((w5 >> 18) & mask);
  out[14] = base + (uint32_t)(((w5 >> 44) | (w6 << 20)) & mask);
  out[15] = base + (uint32_t)((w6 >> 6) & mask);
  out[16] = base + (uint32_t)((w6 >> 32) & mask);
  out[17] = base + (uint32_t)(((w6 >> 58) | (w7 << 6)) & mask);
  out[18] = base + (uint32_t)((w7 >> 20) & mask);
  out[19] = base + (uint32_t)(((w7 >> 46) | (w8 << 18)) & mask);
  out[20] = base + (uint32_t)((w8 >> 8) & mask);
  out[21] = base + (uint32_t)((w8 >> 34) & mask);
  out[22] = base + (uint32_t)(((w8 >> 60) | (w9 << 4)) & mask);
  out[23] = base + (uint32_t)((w9 >> 22) & mask);
  out[24] = base + (uint32_t)(((w9 >> 48) | (w10 << 16)) & mask);
  out[25] = base + (uint32_t)((w10 >> 10) & mask);
  out[26] = base + (uint32_t)((w10 >> 36) & mask);
  out[27] = base + (uint32_t)(((w10 >> 62) | (w11 << 2)) & mask);
  out[28] = base + (uint32_t)((w11 >> 24) & mask);
  out[29] = base + (uint32_t)(((w11 >> 50) | (w12 << 14)) & mask);
  out[30] = base + (uint32_t)((w12 >> 12) & mask);
  out[31] = base + (uint32_t)(w12 >> 38);
  *pout += 32; /* we wrote 32 32-bit integers */
}